

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  Ref<embree::Geometry> *pRVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  int iVar55;
  AABBNodeMB4D *node1;
  ulong uVar56;
  byte bVar57;
  undefined4 uVar58;
  undefined1 (*pauVar59) [32];
  long lVar60;
  ulong uVar61;
  uint uVar62;
  byte bVar63;
  NodeRef root;
  ulong *puVar64;
  bool bVar65;
  ulong uVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [32];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 in_ZMM2 [64];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar114 [32];
  float fVar121;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar124 [64];
  float fVar131;
  undefined1 auVar132 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [64];
  float fVar140;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [64];
  float fVar150;
  undefined1 auVar151 [32];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar152 [64];
  float fVar159;
  undefined1 auVar160 [32];
  float fVar169;
  undefined1 auVar161 [32];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar162 [64];
  float fVar170;
  undefined1 auVar171 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar172 [64];
  uint uVar180;
  float fVar181;
  uint uVar182;
  float fVar183;
  uint uVar184;
  float fVar185;
  uint uVar186;
  float fVar187;
  float fVar188;
  undefined4 uVar189;
  float fVar190;
  undefined4 uVar191;
  float fVar192;
  undefined4 uVar193;
  undefined1 in_ZMM10 [64];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 in_ZMM11 [64];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 in_ZMM12 [64];
  undefined1 auVar208 [36];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 in_ZMM13 [64];
  undefined1 auVar216 [36];
  undefined1 in_ZMM14 [64];
  undefined1 auVar217 [36];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  Precalculations pre;
  vuint<4> *v;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  byte local_5da9;
  Precalculations local_5d91;
  BVH *local_5d90;
  ulong local_5d88;
  RayQueryContext *local_5d80;
  ulong local_5d78;
  ulong local_5d70;
  undefined4 local_5d64;
  undefined1 local_5d60 [32];
  ulong local_5d38;
  Intersectors *local_5d30;
  RayK<8> *local_5d28;
  undefined8 local_5d20;
  int iStack_5d18;
  int iStack_5d14;
  int iStack_5d10;
  int iStack_5d0c;
  int iStack_5d08;
  int iStack_5d04;
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [8];
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  RayK<8> *pRStack_5cc8;
  undefined8 local_5cc0;
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float local_5ca0 [4];
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  ulong local_5c70;
  ulong local_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 local_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined1 local_5c00 [8];
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  undefined1 local_5be0 [32];
  float local_5bc0;
  float fStack_5bbc;
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  undefined4 uStack_5ba4;
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [8];
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  undefined1 local_5a60 [8];
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  undefined1 local_58e0 [32];
  int local_58c0;
  int iStack_58bc;
  int iStack_58b8;
  int iStack_58b4;
  int iStack_58b0;
  int iStack_58ac;
  int iStack_58a8;
  int iStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d90 = (BVH *)This->ptr;
  if ((local_5d90->root).ptr != 8) {
    auVar69 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar68 = ZEXT816(0) << 0x40;
    uVar66 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar68),5);
    uVar56 = vpcmpeqd_avx512vl(auVar69,(undefined1  [32])valid_i->field_0);
    uVar66 = uVar66 & uVar56;
    bVar54 = (byte)uVar66;
    if (bVar54 != 0) {
      local_5a40._0_4_ = *(float *)ray;
      local_5a40._4_4_ = *(float *)(ray + 4);
      local_5a40._8_4_ = *(float *)(ray + 8);
      local_5a40._12_4_ = *(float *)(ray + 0xc);
      local_5a40._16_4_ = *(float *)(ray + 0x10);
      local_5a40._20_4_ = *(float *)(ray + 0x14);
      local_5a40._24_4_ = *(float *)(ray + 0x18);
      local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5a40._32_4_ = *(float *)(ray + 0x20);
      local_5a40._36_4_ = *(float *)(ray + 0x24);
      local_5a40._40_4_ = *(float *)(ray + 0x28);
      local_5a40._44_4_ = *(float *)(ray + 0x2c);
      local_5a40._48_4_ = *(float *)(ray + 0x30);
      local_5a40._52_4_ = *(float *)(ray + 0x34);
      local_5a40._56_4_ = *(float *)(ray + 0x38);
      local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5a40._64_4_ = *(float *)(ray + 0x40);
      local_5a40._68_4_ = *(float *)(ray + 0x44);
      local_5a40._72_4_ = *(float *)(ray + 0x48);
      local_5a40._76_4_ = *(float *)(ray + 0x4c);
      local_5a40._80_4_ = *(float *)(ray + 0x50);
      local_5a40._84_4_ = *(float *)(ray + 0x54);
      local_5a40._88_4_ = *(float *)(ray + 0x58);
      local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar219 = ZEXT3264(auVar69);
      vandps_avx512vl(local_59e0,auVar69);
      auVar70._8_4_ = 0x219392ef;
      auVar70._0_8_ = 0x219392ef219392ef;
      auVar70._12_4_ = 0x219392ef;
      auVar70._16_4_ = 0x219392ef;
      auVar70._20_4_ = 0x219392ef;
      auVar70._24_4_ = 0x219392ef;
      auVar70._28_4_ = 0x219392ef;
      auVar172 = ZEXT3264(auVar70);
      uVar56 = vcmpps_avx512vl(auVar69,auVar70,1);
      bVar65 = (bool)((byte)uVar56 & 1);
      auVar72._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._0_4_;
      bVar65 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar72._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._4_4_;
      bVar65 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar72._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._8_4_;
      bVar65 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar72._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._12_4_;
      bVar65 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar72._16_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._16_4_;
      bVar65 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar72._20_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._20_4_;
      bVar65 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar72._24_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._24_4_;
      bVar65 = SUB81(uVar56 >> 7,0);
      auVar72._28_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59e0._28_4_;
      vandps_avx512vl(local_59c0,auVar69);
      uVar56 = vcmpps_avx512vl(auVar72,auVar70,1);
      bVar65 = (bool)((byte)uVar56 & 1);
      auVar73._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._0_4_;
      bVar65 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar73._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._4_4_;
      bVar65 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar73._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._8_4_;
      bVar65 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar73._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._12_4_;
      bVar65 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar73._16_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._16_4_;
      bVar65 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar73._20_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._20_4_;
      bVar65 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar73._24_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._24_4_;
      bVar65 = SUB81(uVar56 >> 7,0);
      auVar73._28_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59c0._28_4_;
      vandps_avx512vl(local_59a0,auVar69);
      uVar56 = vcmpps_avx512vl(auVar73,auVar70,1);
      bVar65 = (bool)((byte)uVar56 & 1);
      auVar69._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._0_4_;
      bVar65 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._4_4_;
      bVar65 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._8_4_;
      bVar65 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._12_4_;
      bVar65 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar69._16_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._16_4_;
      bVar65 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar69._20_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._20_4_;
      bVar65 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar69._24_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._24_4_;
      bVar65 = SUB81(uVar56 >> 7,0);
      auVar69._28_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * local_59a0._28_4_;
      auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar220 = ZEXT3264(auVar70);
      auVar71 = vrcp14ps_avx512vl(auVar72);
      auVar72 = vfnmadd213ps_avx512vl(auVar72,auVar71,auVar70);
      auVar18 = vfmadd132ps_fma(auVar72,auVar71,auVar71);
      auVar133 = ZEXT1664(auVar18);
      auVar72 = vrcp14ps_avx512vl(auVar73);
      auVar73 = vfnmadd213ps_avx512vl(auVar73,auVar72,auVar70);
      auVar19 = vfmadd132ps_fma(auVar73,auVar72,auVar72);
      auVar143 = ZEXT1664(auVar19);
      auVar72 = vrcp14ps_avx512vl(auVar69);
      auVar162 = ZEXT3264(auVar72);
      auVar69 = vfnmadd213ps_avx512vl(auVar69,auVar72,auVar70);
      local_5980 = ZEXT1632(auVar18);
      local_5960 = ZEXT1632(auVar19);
      auVar20 = vfmadd132ps_fma(auVar69,auVar72,auVar72);
      auVar152 = ZEXT1664(auVar20);
      local_5940 = ZEXT1632(auVar20);
      local_58e0._4_4_ = *(float *)(ray + 0x44) * auVar20._4_4_;
      local_58e0._0_4_ = *(float *)(ray + 0x40) * auVar20._0_4_;
      local_58e0._8_4_ = *(float *)(ray + 0x48) * auVar20._8_4_;
      local_58e0._12_4_ = *(float *)(ray + 0x4c) * auVar20._12_4_;
      local_58e0._16_4_ = *(float *)(ray + 0x50) * 0.0;
      local_58e0._20_4_ = *(float *)(ray + 0x54) * 0.0;
      local_58e0._24_4_ = *(float *)(ray + 0x58) * 0.0;
      local_58e0._28_4_ = *(undefined4 *)(ray + 0x5c);
      auVar124 = ZEXT3264(local_58e0);
      local_5920 = *(float *)ray * auVar18._0_4_;
      fStack_591c = *(float *)(ray + 4) * auVar18._4_4_;
      fStack_5918 = *(float *)(ray + 8) * auVar18._8_4_;
      fStack_5914 = *(float *)(ray + 0xc) * auVar18._12_4_;
      fStack_5910 = *(float *)(ray + 0x10) * 0.0;
      fStack_590c = *(float *)(ray + 0x14) * 0.0;
      fStack_5908 = *(float *)(ray + 0x18) * 0.0;
      uStack_5904 = *(undefined4 *)(ray + 0x1c);
      local_5900 = *(float *)(ray + 0x20) * auVar19._0_4_;
      fStack_58fc = *(float *)(ray + 0x24) * auVar19._4_4_;
      fStack_58f8 = *(float *)(ray + 0x28) * auVar19._8_4_;
      fStack_58f4 = *(float *)(ray + 0x2c) * auVar19._12_4_;
      fStack_58f0 = *(float *)(ray + 0x30) * 0.0;
      fStack_58ec = *(float *)(ray + 0x34) * 0.0;
      fStack_58e8 = *(float *)(ray + 0x38) * 0.0;
      uStack_58e4 = *(undefined4 *)(ray + 0x3c);
      uVar56 = vcmpps_avx512vl(ZEXT1632(auVar18),ZEXT1632(auVar68),1);
      auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_58c0 = (uint)((byte)uVar56 & 1) * auVar69._0_4_;
      iStack_58bc = (uint)((byte)(uVar56 >> 1) & 1) * auVar69._4_4_;
      iStack_58b8 = (uint)((byte)(uVar56 >> 2) & 1) * auVar69._8_4_;
      iStack_58b4 = (uint)((byte)(uVar56 >> 3) & 1) * auVar69._12_4_;
      iStack_58b0 = (uint)((byte)(uVar56 >> 4) & 1) * auVar69._16_4_;
      iStack_58ac = (uint)((byte)(uVar56 >> 5) & 1) * auVar69._20_4_;
      iStack_58a8 = (uint)((byte)(uVar56 >> 6) & 1) * auVar69._24_4_;
      iStack_58a4 = (uint)(byte)(uVar56 >> 7) * auVar69._28_4_;
      auVar72 = ZEXT1632(auVar68);
      uVar56 = vcmpps_avx512vl(ZEXT1632(auVar19),auVar72,5);
      auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar65 = (bool)((byte)uVar56 & 1);
      bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar56 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar56 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar56 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar56 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
      bVar13 = SUB81(uVar56 >> 7,0);
      local_58a0 = (uint)bVar65 * auVar69._0_4_ | (uint)!bVar65 * 0x60;
      uStack_589c = (uint)bVar7 * auVar69._4_4_ | (uint)!bVar7 * 0x60;
      uStack_5898 = (uint)bVar8 * auVar69._8_4_ | (uint)!bVar8 * 0x60;
      uStack_5894 = (uint)bVar9 * auVar69._12_4_ | (uint)!bVar9 * 0x60;
      uStack_5890 = (uint)bVar10 * auVar69._16_4_ | (uint)!bVar10 * 0x60;
      uStack_588c = (uint)bVar11 * auVar69._20_4_ | (uint)!bVar11 * 0x60;
      uStack_5888 = (uint)bVar12 * auVar69._24_4_ | (uint)!bVar12 * 0x60;
      uStack_5884 = (uint)bVar13 * auVar69._28_4_ | (uint)!bVar13 * 0x60;
      uVar56 = vcmpps_avx512vl(ZEXT1632(auVar20),auVar72,5);
      auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar65 = (bool)((byte)uVar56 & 1);
      bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar56 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar56 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar56 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar56 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
      bVar13 = SUB81(uVar56 >> 7,0);
      local_5880 = (uint)bVar65 * auVar69._0_4_ | (uint)!bVar65 * 0xa0;
      uStack_587c = (uint)bVar7 * auVar69._4_4_ | (uint)!bVar7 * 0xa0;
      uStack_5878 = (uint)bVar8 * auVar69._8_4_ | (uint)!bVar8 * 0xa0;
      uStack_5874 = (uint)bVar9 * auVar69._12_4_ | (uint)!bVar9 * 0xa0;
      uStack_5870 = (uint)bVar10 * auVar69._16_4_ | (uint)!bVar10 * 0xa0;
      uStack_586c = (uint)bVar11 * auVar69._20_4_ | (uint)!bVar11 * 0xa0;
      uStack_5868 = (uint)bVar12 * auVar69._24_4_ | (uint)!bVar12 * 0xa0;
      uStack_5864 = (uint)bVar13 * auVar69._28_4_ | (uint)!bVar13 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar222 = ZEXT3264(local_4680);
      local_5d64 = (undefined4)uVar66;
      auVar69 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar72);
      local_5860._0_4_ =
           (uint)(bVar54 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar54 & 1) * local_4680._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      local_5860._4_4_ = (uint)bVar65 * auVar69._4_4_ | (uint)!bVar65 * local_4680._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      local_5860._8_4_ = (uint)bVar65 * auVar69._8_4_ | (uint)!bVar65 * local_4680._8_4_;
      bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
      local_5860._12_4_ = (uint)bVar65 * auVar69._12_4_ | (uint)!bVar65 * local_4680._12_4_;
      bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
      local_5860._16_4_ = (uint)bVar65 * auVar69._16_4_ | (uint)!bVar65 * local_4680._16_4_;
      bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
      local_5860._20_4_ = (uint)bVar65 * auVar69._20_4_ | (uint)!bVar65 * local_4680._20_4_;
      bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
      local_5860._24_4_ = (uint)bVar65 * auVar69._24_4_ | (uint)!bVar65 * local_4680._24_4_;
      bVar65 = SUB81(uVar66 >> 7,0);
      local_5860._28_4_ = (uint)bVar65 * auVar69._28_4_ | (uint)!bVar65 * local_4680._28_4_;
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar221 = ZEXT3264(auVar69);
      auVar72 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar72);
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar66 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar66 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar66 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar66 >> 6) & 1);
      bVar12 = SUB81(uVar66 >> 7,0);
      local_5840._4_4_ = (uint)bVar65 * auVar72._4_4_ | (uint)!bVar65 * auVar69._4_4_;
      local_5840._0_4_ =
           (uint)(bVar54 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar69._0_4_;
      local_5840._8_4_ = (uint)bVar7 * auVar72._8_4_ | (uint)!bVar7 * auVar69._8_4_;
      local_5840._12_4_ = (uint)bVar8 * auVar72._12_4_ | (uint)!bVar8 * auVar69._12_4_;
      local_5840._16_4_ = (uint)bVar9 * auVar72._16_4_ | (uint)!bVar9 * auVar69._16_4_;
      local_5840._20_4_ = (uint)bVar10 * auVar72._20_4_ | (uint)!bVar10 * auVar69._20_4_;
      local_5840._24_4_ = (uint)bVar11 * auVar72._24_4_ | (uint)!bVar11 * auVar69._24_4_;
      local_5840._28_4_ = (uint)bVar12 * auVar72._28_4_ | (uint)!bVar12 * auVar69._28_4_;
      bVar54 = ~bVar54;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar62 = 7;
      }
      else {
        uVar62 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5d28 = ray + 0x100;
      puVar64 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar59 = (undefined1 (*) [32])local_4640;
      local_5808 = (local_5d90->root).ptr;
      local_4660 = local_5860;
      auVar68 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar223 = ZEXT1664(auVar68);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar224 = ZEXT3264(auVar69);
      local_5d80 = context;
      local_5d30 = This;
      do {
        pauVar59 = pauVar59 + -1;
        root.ptr = puVar64[-1];
        puVar64 = puVar64 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00877403:
          iVar55 = 3;
        }
        else {
          auVar69 = *pauVar59;
          uVar66 = vcmpps_avx512vl(auVar69,local_5840,1);
          if ((char)uVar66 == '\0') {
LAB_00877414:
            iVar55 = 2;
          }
          else {
            uVar58 = (undefined4)uVar66;
            iVar55 = 0;
            if ((uint)POPCOUNT(uVar58) <= uVar62) {
              do {
                local_5d60 = auVar69;
                local_5d20 = 0;
                for (uVar56 = uVar66; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000)
                {
                  local_5d20 = local_5d20 + 1;
                }
                auVar124 = ZEXT1664(auVar124._0_16_);
                auVar133 = ZEXT1664(auVar133._0_16_);
                auVar143 = ZEXT1664(auVar143._0_16_);
                auVar152 = ZEXT1664(auVar152._0_16_);
                auVar162 = ZEXT1664(auVar162._0_16_);
                auVar172 = ZEXT1664(auVar172._0_16_);
                in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                local_5d88 = uVar66;
                bVar65 = occluded1(local_5d30,local_5d90,root,local_5d20,&local_5d91,ray,
                                   (TravRayK<8,_false> *)&local_5a40.field_0,local_5d80);
                bVar63 = (byte)(1 << ((uint)local_5d20 & 0x1f));
                if (!bVar65) {
                  bVar63 = 0;
                }
                bVar54 = bVar54 | bVar63;
                uVar66 = local_5d88 - 1 & local_5d88;
                auVar69 = local_5d60;
              } while (uVar66 != 0);
              if (bVar54 == 0xff) {
                iVar55 = 3;
              }
              else {
                auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_5840._0_4_ =
                     (uint)(bVar54 & 1) * auVar72._0_4_ |
                     (uint)!(bool)(bVar54 & 1) * local_5840._0_4_;
                bVar65 = (bool)(bVar54 >> 1 & 1);
                local_5840._4_4_ = (uint)bVar65 * auVar72._4_4_ | (uint)!bVar65 * local_5840._4_4_;
                bVar65 = (bool)(bVar54 >> 2 & 1);
                local_5840._8_4_ = (uint)bVar65 * auVar72._8_4_ | (uint)!bVar65 * local_5840._8_4_;
                bVar65 = (bool)(bVar54 >> 3 & 1);
                local_5840._12_4_ =
                     (uint)bVar65 * auVar72._12_4_ | (uint)!bVar65 * local_5840._12_4_;
                bVar65 = (bool)(bVar54 >> 4 & 1);
                local_5840._16_4_ =
                     (uint)bVar65 * auVar72._16_4_ | (uint)!bVar65 * local_5840._16_4_;
                bVar65 = (bool)(bVar54 >> 5 & 1);
                local_5840._20_4_ =
                     (uint)bVar65 * auVar72._20_4_ | (uint)!bVar65 * local_5840._20_4_;
                bVar65 = (bool)(bVar54 >> 6 & 1);
                local_5840._24_4_ =
                     (uint)bVar65 * auVar72._24_4_ | (uint)!bVar65 * local_5840._24_4_;
                local_5840._28_4_ =
                     (uint)(bVar54 >> 7) * auVar72._28_4_ |
                     (uint)!(bool)(bVar54 >> 7) * local_5840._28_4_;
                iVar55 = 2;
              }
              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar219 = ZEXT3264(auVar72);
              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar220 = ZEXT3264(auVar72);
              auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar221 = ZEXT3264(auVar72);
              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar222 = ZEXT3264(auVar72);
              auVar68 = vxorps_avx512vl(auVar223._0_16_,auVar223._0_16_);
              auVar223 = ZEXT1664(auVar68);
              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar224 = ZEXT3264(auVar72);
            }
            auVar218 = ZEXT3264(auVar69);
            if (uVar62 < (uint)POPCOUNT(uVar58)) {
              do {
                auVar69 = auVar218._0_32_;
                uVar180 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00877403;
                  uVar16 = vcmpps_avx512vl(auVar69,local_5840,9);
                  if ((char)uVar16 != '\0') {
                    local_5c70 = (ulong)(uVar180 & 0xf) - 8;
                    bVar63 = bVar54;
                    if (local_5c70 != 0) {
                      local_5da9 = ~bVar54;
                      uVar66 = 0;
                      do {
                        local_5c68 = uVar66;
                        lVar60 = uVar66 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                        local_5d78 = 0;
                        local_5d70 = (ulong)local_5da9;
                        for (uVar66 = local_5d70; (uVar66 & 1) == 0;
                            uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                          local_5d78 = local_5d78 + 1;
                        }
                        local_5d60._0_8_ = lVar60;
                        uVar66 = 0;
                        bVar63 = local_5da9;
                        while( true ) {
                          fVar169 = auVar162._28_4_;
                          fVar179 = auVar172._28_4_;
                          auVar216 = in_ZMM13._28_36_;
                          auVar208 = in_ZMM12._28_36_;
                          auVar217 = in_ZMM14._28_36_;
                          if (*(int *)(lVar60 + 0x40 + uVar66 * 4) == -1) break;
                          pRVar2 = (local_5d80->scene->geometries).items;
                          pGVar3 = pRVar2[*(uint *)(lVar60 + 0x30 + uVar66 * 4)].ptr;
                          fVar112 = (pGVar3->time_range).lower;
                          auVar74._4_4_ = fVar112;
                          auVar74._0_4_ = fVar112;
                          auVar74._8_4_ = fVar112;
                          auVar74._12_4_ = fVar112;
                          auVar74._16_4_ = fVar112;
                          auVar74._20_4_ = fVar112;
                          auVar74._24_4_ = fVar112;
                          auVar74._28_4_ = fVar112;
                          fVar90 = pGVar3->fnumTimeSegments;
                          auVar68._4_4_ = fVar90;
                          auVar68._0_4_ = fVar90;
                          auVar68._8_4_ = fVar90;
                          auVar68._12_4_ = fVar90;
                          auVar72 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar74);
                          fVar112 = (pGVar3->time_range).upper - fVar112;
                          auVar75._4_4_ = fVar112;
                          auVar75._0_4_ = fVar112;
                          auVar75._8_4_ = fVar112;
                          auVar75._12_4_ = fVar112;
                          auVar75._16_4_ = fVar112;
                          auVar75._20_4_ = fVar112;
                          auVar75._24_4_ = fVar112;
                          auVar75._28_4_ = fVar112;
                          auVar69 = vdivps_avx(auVar72,auVar75);
                          auVar71._4_4_ = fVar90 * auVar69._4_4_;
                          auVar71._0_4_ = fVar90 * auVar69._0_4_;
                          auVar71._8_4_ = fVar90 * auVar69._8_4_;
                          auVar71._12_4_ = fVar90 * auVar69._12_4_;
                          auVar71._16_4_ = fVar90 * auVar69._16_4_;
                          auVar71._20_4_ = fVar90 * auVar69._20_4_;
                          auVar71._24_4_ = fVar90 * auVar69._24_4_;
                          auVar71._28_4_ = auVar69._28_4_;
                          auVar69 = vroundps_avx(auVar71,1);
                          auVar68 = vaddss_avx512f(auVar68,SUB6416(ZEXT464(0xbf800000),0));
                          auVar76._0_4_ = auVar68._0_4_;
                          auVar76._4_4_ = auVar76._0_4_;
                          auVar76._8_4_ = auVar76._0_4_;
                          auVar76._12_4_ = auVar76._0_4_;
                          auVar76._16_4_ = auVar76._0_4_;
                          auVar76._20_4_ = auVar76._0_4_;
                          auVar76._24_4_ = auVar76._0_4_;
                          auVar76._28_4_ = auVar76._0_4_;
                          auVar69 = vminps_avx(auVar69,auVar76);
                          auVar70 = auVar223._0_32_;
                          auVar69 = vmaxps_avx512vl(auVar69,auVar70);
                          local_5d00 = vcvtps2dq_avx(auVar69);
                          fVar112 = local_5d00._28_4_;
                          auVar69 = vsubps_avx(auVar71,auVar69);
                          auVar73 = vpbroadcastd_avx512vl();
                          uVar16 = vpcmpeqd_avx512vl(auVar73,local_5d00);
                          local_5d88 = CONCAT71(local_5d88._1_7_,bVar63);
                          auVar73 = auVar220._0_32_;
                          if ((byte)((byte)uVar16 | ~local_5da9) == 0xff) {
                            lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives +
                                             (long)*(int *)(local_5d00 + local_5d78 * 4) * 0x38);
                            lVar5 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                                             (long)*(int *)(local_5d00 + local_5d78 * 4) * 0x38);
                            uVar61 = (ulong)*(uint *)(lVar60 + uVar66 * 4);
                            uVar56 = (ulong)*(uint *)(lVar60 + 0x10 + uVar66 * 4);
                            auVar72 = vsubps_avx512vl(auVar73,auVar69);
                            uVar58 = *(undefined4 *)(lVar5 + uVar61 * 4);
                            auVar86._4_4_ = uVar58;
                            auVar86._0_4_ = uVar58;
                            auVar86._8_4_ = uVar58;
                            auVar86._12_4_ = uVar58;
                            auVar86._16_4_ = uVar58;
                            auVar86._20_4_ = uVar58;
                            auVar86._24_4_ = uVar58;
                            auVar86._28_4_ = uVar58;
                            auVar71 = vmulps_avx512vl(auVar69,auVar86);
                            uVar58 = *(undefined4 *)(lVar5 + 4 + uVar61 * 4);
                            auVar87._4_4_ = uVar58;
                            auVar87._0_4_ = uVar58;
                            auVar87._8_4_ = uVar58;
                            auVar87._12_4_ = uVar58;
                            auVar87._16_4_ = uVar58;
                            auVar87._20_4_ = uVar58;
                            auVar87._24_4_ = uVar58;
                            auVar87._28_4_ = uVar58;
                            auVar74 = vmulps_avx512vl(auVar69,auVar87);
                            uVar58 = *(undefined4 *)(lVar5 + 8 + uVar61 * 4);
                            auVar31._4_4_ = uVar58;
                            auVar31._0_4_ = uVar58;
                            auVar31._8_4_ = uVar58;
                            auVar31._12_4_ = uVar58;
                            auVar31._16_4_ = uVar58;
                            auVar31._20_4_ = uVar58;
                            auVar31._24_4_ = uVar58;
                            auVar31._28_4_ = uVar58;
                            auVar75 = vmulps_avx512vl(auVar69,auVar31);
                            uVar58 = *(undefined4 *)(lVar4 + uVar61 * 4);
                            auVar32._4_4_ = uVar58;
                            auVar32._0_4_ = uVar58;
                            auVar32._8_4_ = uVar58;
                            auVar32._12_4_ = uVar58;
                            auVar32._16_4_ = uVar58;
                            auVar32._20_4_ = uVar58;
                            auVar32._24_4_ = uVar58;
                            auVar32._28_4_ = uVar58;
                            auVar77 = vfmadd231ps_avx512vl(auVar71,auVar72,auVar32);
                            uVar58 = *(undefined4 *)(lVar4 + 4 + uVar61 * 4);
                            auVar33._4_4_ = uVar58;
                            auVar33._0_4_ = uVar58;
                            auVar33._8_4_ = uVar58;
                            auVar33._12_4_ = uVar58;
                            auVar33._16_4_ = uVar58;
                            auVar33._20_4_ = uVar58;
                            auVar33._24_4_ = uVar58;
                            auVar33._28_4_ = uVar58;
                            auVar78 = vfmadd231ps_avx512vl(auVar74,auVar72,auVar33);
                            uVar58 = *(undefined4 *)(lVar4 + 8 + uVar61 * 4);
                            auVar34._4_4_ = uVar58;
                            auVar34._0_4_ = uVar58;
                            auVar34._8_4_ = uVar58;
                            auVar34._12_4_ = uVar58;
                            auVar34._16_4_ = uVar58;
                            auVar34._20_4_ = uVar58;
                            auVar34._24_4_ = uVar58;
                            auVar34._28_4_ = uVar58;
                            auVar79 = vfmadd231ps_avx512vl(auVar75,auVar72,auVar34);
                            uVar58 = *(undefined4 *)(lVar5 + uVar56 * 4);
                            auVar35._4_4_ = uVar58;
                            auVar35._0_4_ = uVar58;
                            auVar35._8_4_ = uVar58;
                            auVar35._12_4_ = uVar58;
                            auVar35._16_4_ = uVar58;
                            auVar35._20_4_ = uVar58;
                            auVar35._24_4_ = uVar58;
                            auVar35._28_4_ = uVar58;
                            auVar71 = vmulps_avx512vl(auVar69,auVar35);
                            uVar58 = *(undefined4 *)(lVar5 + 4 + uVar56 * 4);
                            auVar36._4_4_ = uVar58;
                            auVar36._0_4_ = uVar58;
                            auVar36._8_4_ = uVar58;
                            auVar36._12_4_ = uVar58;
                            auVar36._16_4_ = uVar58;
                            auVar36._20_4_ = uVar58;
                            auVar36._24_4_ = uVar58;
                            auVar36._28_4_ = uVar58;
                            auVar74 = vmulps_avx512vl(auVar69,auVar36);
                            uVar58 = *(undefined4 *)(lVar5 + 8 + uVar56 * 4);
                            auVar37._4_4_ = uVar58;
                            auVar37._0_4_ = uVar58;
                            auVar37._8_4_ = uVar58;
                            auVar37._12_4_ = uVar58;
                            auVar37._16_4_ = uVar58;
                            auVar37._20_4_ = uVar58;
                            auVar37._24_4_ = uVar58;
                            auVar37._28_4_ = uVar58;
                            auVar75 = vmulps_avx512vl(auVar69,auVar37);
                            uVar58 = *(undefined4 *)(lVar4 + uVar56 * 4);
                            auVar38._4_4_ = uVar58;
                            auVar38._0_4_ = uVar58;
                            auVar38._8_4_ = uVar58;
                            auVar38._12_4_ = uVar58;
                            auVar38._16_4_ = uVar58;
                            auVar38._20_4_ = uVar58;
                            auVar38._24_4_ = uVar58;
                            auVar38._28_4_ = uVar58;
                            auVar80 = vfmadd231ps_avx512vl(auVar71,auVar72,auVar38);
                            uVar58 = *(undefined4 *)(lVar4 + 4 + uVar56 * 4);
                            auVar39._4_4_ = uVar58;
                            auVar39._0_4_ = uVar58;
                            auVar39._8_4_ = uVar58;
                            auVar39._12_4_ = uVar58;
                            auVar39._16_4_ = uVar58;
                            auVar39._20_4_ = uVar58;
                            auVar39._24_4_ = uVar58;
                            auVar39._28_4_ = uVar58;
                            auVar81 = vfmadd231ps_avx512vl(auVar74,auVar72,auVar39);
                            uVar58 = *(undefined4 *)(lVar4 + 8 + uVar56 * 4);
                            auVar40._4_4_ = uVar58;
                            auVar40._0_4_ = uVar58;
                            auVar40._8_4_ = uVar58;
                            auVar40._12_4_ = uVar58;
                            auVar40._16_4_ = uVar58;
                            auVar40._20_4_ = uVar58;
                            auVar40._24_4_ = uVar58;
                            auVar40._28_4_ = uVar58;
                            auVar82 = vfmadd231ps_avx512vl(auVar75,auVar72,auVar40);
                            uVar56 = (ulong)*(uint *)(lVar60 + 0x20 + uVar66 * 4);
                            uVar58 = *(undefined4 *)(lVar5 + uVar56 * 4);
                            auVar41._4_4_ = uVar58;
                            auVar41._0_4_ = uVar58;
                            auVar41._8_4_ = uVar58;
                            auVar41._12_4_ = uVar58;
                            auVar41._16_4_ = uVar58;
                            auVar41._20_4_ = uVar58;
                            auVar41._24_4_ = uVar58;
                            auVar41._28_4_ = uVar58;
                            auVar71 = vmulps_avx512vl(auVar69,auVar41);
                            uVar58 = *(undefined4 *)(lVar5 + 4 + uVar56 * 4);
                            auVar42._4_4_ = uVar58;
                            auVar42._0_4_ = uVar58;
                            auVar42._8_4_ = uVar58;
                            auVar42._12_4_ = uVar58;
                            auVar42._16_4_ = uVar58;
                            auVar42._20_4_ = uVar58;
                            auVar42._24_4_ = uVar58;
                            auVar42._28_4_ = uVar58;
                            auVar74 = vmulps_avx512vl(auVar69,auVar42);
                            uVar58 = *(undefined4 *)(lVar5 + 8 + uVar56 * 4);
                            auVar43._4_4_ = uVar58;
                            auVar43._0_4_ = uVar58;
                            auVar43._8_4_ = uVar58;
                            auVar43._12_4_ = uVar58;
                            auVar43._16_4_ = uVar58;
                            auVar43._20_4_ = uVar58;
                            auVar43._24_4_ = uVar58;
                            auVar43._28_4_ = uVar58;
                            auVar69 = vmulps_avx512vl(auVar69,auVar43);
                            uVar58 = *(undefined4 *)(lVar4 + uVar56 * 4);
                            auVar44._4_4_ = uVar58;
                            auVar44._0_4_ = uVar58;
                            auVar44._8_4_ = uVar58;
                            auVar44._12_4_ = uVar58;
                            auVar44._16_4_ = uVar58;
                            auVar44._20_4_ = uVar58;
                            auVar44._24_4_ = uVar58;
                            auVar44._28_4_ = uVar58;
                            auVar83 = vfmadd231ps_avx512vl(auVar71,auVar72,auVar44);
                            uVar58 = *(undefined4 *)(lVar4 + 4 + uVar56 * 4);
                            auVar45._4_4_ = uVar58;
                            auVar45._0_4_ = uVar58;
                            auVar45._8_4_ = uVar58;
                            auVar45._12_4_ = uVar58;
                            auVar45._16_4_ = uVar58;
                            auVar45._20_4_ = uVar58;
                            auVar45._24_4_ = uVar58;
                            auVar45._28_4_ = uVar58;
                            auVar84 = vfmadd231ps_avx512vl(auVar74,auVar72,auVar45);
                            uVar58 = *(undefined4 *)(lVar4 + 8 + uVar56 * 4);
                            auVar46._4_4_ = uVar58;
                            auVar46._0_4_ = uVar58;
                            auVar46._8_4_ = uVar58;
                            auVar46._12_4_ = uVar58;
                            auVar46._16_4_ = uVar58;
                            auVar46._20_4_ = uVar58;
                            auVar46._24_4_ = uVar58;
                            auVar46._28_4_ = uVar58;
                            auVar85 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar46);
                          }
                          else {
                            if (local_5da9 != 0) {
                              lVar60 = *(long *)&pGVar3[2].numPrimitives;
                              uVar67 = (ulong)*(uint *)(local_5d60._0_8_ + uVar66 * 4);
                              uVar61 = local_5d70;
                              uVar56 = local_5d78;
                              do {
                                auVar68 = *(undefined1 (*) [16])
                                           (*(long *)(lVar60 + (long)*(int *)(local_5d00 +
                                                                             uVar56 * 4) * 0x38) +
                                           uVar67 * 4);
                                auVar18 = *(undefined1 (*) [16])
                                           (*(long *)(lVar60 + 0x38 +
                                                     (long)*(int *)(local_5d00 + uVar56 * 4) * 0x38)
                                           + uVar67 * 4);
                                fVar112 = 0.0;
                                *(int *)((long)&local_5c40 + uVar56 * 4) = auVar68._0_4_;
                                uVar58 = vextractps_avx(auVar68,1);
                                *(undefined4 *)((long)&local_5c20 + uVar56 * 4) = uVar58;
                                uVar58 = vextractps_avx(auVar68,2);
                                *(undefined4 *)(local_5c00 + uVar56 * 4) = uVar58;
                                *(int *)(local_5ce0 + uVar56 * 4) = auVar18._0_4_;
                                uVar58 = vextractps_avx(auVar18,1);
                                *(undefined4 *)((long)&local_5cc0 + uVar56 * 4) = uVar58;
                                fVar90 = (float)vextractps_avx(auVar18,2);
                                local_5ca0[uVar56] = fVar90;
                                uVar61 = uVar61 ^ 1L << (uVar56 & 0x3f);
                                uVar56 = 0;
                                for (uVar14 = uVar61; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar56 = uVar56 + 1;
                                }
                              } while (uVar61 != 0);
                            }
                            auVar71 = vsubps_avx512vl(auVar73,auVar69);
                            fVar98 = auVar71._0_4_;
                            fVar105 = fVar98 * (float)local_5c40;
                            fVar99 = auVar71._4_4_;
                            fVar106 = fVar99 * local_5c40._4_4_;
                            fVar100 = auVar71._8_4_;
                            fVar107 = fVar100 * (float)uStack_5c38;
                            fVar101 = auVar71._12_4_;
                            fVar108 = fVar101 * uStack_5c38._4_4_;
                            fVar102 = auVar71._16_4_;
                            fVar109 = fVar102 * (float)uStack_5c30;
                            fVar103 = auVar71._20_4_;
                            fVar110 = fVar103 * uStack_5c30._4_4_;
                            fVar104 = auVar71._24_4_;
                            fVar111 = fVar104 * (float)uStack_5c28;
                            fVar121 = fVar98 * (float)local_5c20;
                            fVar125 = fVar99 * local_5c20._4_4_;
                            fVar126 = fVar100 * (float)uStack_5c18;
                            fVar127 = fVar101 * uStack_5c18._4_4_;
                            fVar128 = fVar102 * (float)uStack_5c10;
                            fVar129 = fVar103 * uStack_5c10._4_4_;
                            fVar130 = fVar104 * (float)uStack_5c08;
                            fVar131 = fVar98 * (float)local_5c00._0_4_;
                            fVar134 = fVar99 * (float)local_5c00._4_4_;
                            fVar135 = fVar100 * fStack_5bf8;
                            fVar136 = fVar101 * fStack_5bf4;
                            fVar137 = fVar102 * fStack_5bf0;
                            fVar138 = fVar103 * fStack_5bec;
                            fVar139 = fVar104 * fStack_5be8;
                            fVar90 = auVar69._0_4_;
                            fVar113 = fVar90 * (float)local_5ce0._0_4_;
                            fVar92 = auVar69._4_4_;
                            fVar115 = fVar92 * (float)local_5ce0._4_4_;
                            fVar93 = auVar69._8_4_;
                            fVar116 = fVar93 * (float)uStack_5cd8;
                            fVar94 = auVar69._12_4_;
                            fVar117 = fVar94 * uStack_5cd8._4_4_;
                            fVar95 = auVar69._16_4_;
                            fVar118 = fVar95 * (float)uStack_5cd0;
                            fVar96 = auVar69._20_4_;
                            fVar119 = fVar96 * uStack_5cd0._4_4_;
                            fVar97 = auVar69._24_4_;
                            fVar120 = fVar97 * pRStack_5cc8._0_4_;
                            fVar140 = fVar90 * (float)local_5cc0;
                            fVar144 = fVar92 * local_5cc0._4_4_;
                            fVar145 = fVar93 * fStack_5cb8;
                            fVar146 = fVar94 * fStack_5cb4;
                            fVar147 = fVar95 * fStack_5cb0;
                            fVar148 = fVar96 * fStack_5cac;
                            fVar149 = fVar97 * fStack_5ca8;
                            fVar150 = fVar90 * local_5ca0[0];
                            fVar153 = fVar92 * local_5ca0[1];
                            fVar154 = fVar93 * local_5ca0[2];
                            fVar155 = fVar94 * local_5ca0[3];
                            fVar156 = fVar95 * fStack_5c90;
                            fVar157 = fVar96 * fStack_5c8c;
                            fVar158 = fVar97 * fStack_5c88;
                            if (local_5da9 != 0) {
                              lVar60 = *(long *)&pGVar3[2].numPrimitives;
                              uVar67 = (ulong)*(uint *)(local_5d60._0_8_ + 0x10 + uVar66 * 4);
                              uVar61 = local_5d70;
                              uVar56 = local_5d78;
                              do {
                                auVar68 = *(undefined1 (*) [16])
                                           (*(long *)(lVar60 + (long)*(int *)(local_5d00 +
                                                                             uVar56 * 4) * 0x38) +
                                           uVar67 * 4);
                                fVar169 = 0.0;
                                auVar18 = *(undefined1 (*) [16])
                                           (*(long *)(lVar60 + 0x38 +
                                                     (long)*(int *)(local_5d00 + uVar56 * 4) * 0x38)
                                           + uVar67 * 4);
                                fVar179 = 0.0;
                                *(int *)((long)&local_5c40 + uVar56 * 4) = auVar68._0_4_;
                                uVar58 = vextractps_avx(auVar68,1);
                                *(undefined4 *)((long)&local_5c20 + uVar56 * 4) = uVar58;
                                uVar58 = vextractps_avx(auVar68,2);
                                *(undefined4 *)(local_5c00 + uVar56 * 4) = uVar58;
                                *(int *)(local_5ce0 + uVar56 * 4) = auVar18._0_4_;
                                uVar58 = vextractps_avx(auVar18,1);
                                *(undefined4 *)((long)&local_5cc0 + uVar56 * 4) = uVar58;
                                fVar159 = (float)vextractps_avx(auVar18,2);
                                local_5ca0[uVar56] = fVar159;
                                uVar61 = uVar61 ^ 1L << (uVar56 & 0x3f);
                                uVar56 = 0;
                                for (uVar14 = uVar61; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar56 = uVar56 + 1;
                                }
                              } while (uVar61 != 0);
                            }
                            fVar170 = fVar98 * (float)local_5c40;
                            fVar173 = fVar99 * local_5c40._4_4_;
                            fVar174 = fVar100 * (float)uStack_5c38;
                            fVar175 = fVar101 * uStack_5c38._4_4_;
                            fVar176 = fVar102 * (float)uStack_5c30;
                            fVar177 = fVar103 * uStack_5c30._4_4_;
                            fVar178 = fVar104 * (float)uStack_5c28;
                            fVar181 = fVar98 * (float)local_5c20;
                            fVar183 = fVar99 * local_5c20._4_4_;
                            fVar185 = fVar100 * (float)uStack_5c18;
                            fVar187 = fVar101 * uStack_5c18._4_4_;
                            fVar188 = fVar102 * (float)uStack_5c10;
                            fVar190 = fVar103 * uStack_5c10._4_4_;
                            fVar192 = fVar104 * (float)uStack_5c08;
                            fVar159 = fVar98 * (float)local_5c00._0_4_;
                            fVar163 = fVar99 * (float)local_5c00._4_4_;
                            fVar164 = fVar100 * fStack_5bf8;
                            fVar165 = fVar101 * fStack_5bf4;
                            fVar166 = fVar102 * fStack_5bf0;
                            fVar167 = fVar103 * fStack_5bec;
                            fVar168 = fVar104 * fStack_5be8;
                            fVar201 = fVar90 * (float)local_5ce0._0_4_;
                            fVar202 = fVar92 * (float)local_5ce0._4_4_;
                            fVar203 = fVar93 * (float)uStack_5cd8;
                            fVar204 = fVar94 * uStack_5cd8._4_4_;
                            fVar205 = fVar95 * (float)uStack_5cd0;
                            fVar206 = fVar96 * uStack_5cd0._4_4_;
                            fVar207 = fVar97 * pRStack_5cc8._0_4_;
                            auVar208 = ZEXT436((uint)in_ZMM12._28_4_);
                            fVar209 = fVar90 * (float)local_5cc0;
                            fVar210 = fVar92 * local_5cc0._4_4_;
                            fVar211 = fVar93 * fStack_5cb8;
                            fVar212 = fVar94 * fStack_5cb4;
                            fVar213 = fVar95 * fStack_5cb0;
                            fVar214 = fVar96 * fStack_5cac;
                            fVar215 = fVar97 * fStack_5ca8;
                            auVar216 = ZEXT436((uint)in_ZMM13._28_4_);
                            fVar194 = fVar90 * local_5ca0[0];
                            fVar195 = fVar92 * local_5ca0[1];
                            fVar196 = fVar93 * local_5ca0[2];
                            fVar197 = fVar94 * local_5ca0[3];
                            fVar198 = fVar95 * fStack_5c90;
                            fVar199 = fVar96 * fStack_5c8c;
                            fVar200 = fVar97 * fStack_5c88;
                            if (local_5da9 != 0) {
                              lVar60 = *(long *)&pGVar3[2].numPrimitives;
                              uVar67 = (ulong)*(uint *)(local_5d60._0_8_ + 0x20 + uVar66 * 4);
                              uVar61 = local_5d70;
                              uVar56 = local_5d78;
                              do {
                                auVar68 = *(undefined1 (*) [16])
                                           (*(long *)(lVar60 + (long)*(int *)(local_5d00 +
                                                                             uVar56 * 4) * 0x38) +
                                           uVar67 * 4);
                                auVar217 = (undefined1  [36])0x0;
                                auVar18 = *(undefined1 (*) [16])
                                           (*(long *)(lVar60 + 0x38 +
                                                     (long)*(int *)(local_5d00 + uVar56 * 4) * 0x38)
                                           + uVar67 * 4);
                                *(int *)((long)&local_5c40 + uVar56 * 4) = auVar68._0_4_;
                                uVar58 = vextractps_avx(auVar68,1);
                                *(undefined4 *)((long)&local_5c20 + uVar56 * 4) = uVar58;
                                uVar58 = vextractps_avx(auVar68,2);
                                *(undefined4 *)(local_5c00 + uVar56 * 4) = uVar58;
                                *(int *)(local_5ce0 + uVar56 * 4) = auVar18._0_4_;
                                uVar58 = vextractps_avx(auVar18,1);
                                *(undefined4 *)((long)&local_5cc0 + uVar56 * 4) = uVar58;
                                fVar1 = (float)vextractps_avx(auVar18,2);
                                local_5ca0[uVar56] = fVar1;
                                uVar61 = uVar61 ^ 1L << (uVar56 & 0x3f);
                                uVar56 = 0;
                                for (uVar14 = uVar61; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar56 = uVar56 + 1;
                                }
                              } while (uVar61 != 0);
                            }
                            auVar77._0_4_ = fVar105 + fVar113;
                            auVar77._4_4_ = fVar106 + fVar115;
                            auVar77._8_4_ = fVar107 + fVar116;
                            auVar77._12_4_ = fVar108 + fVar117;
                            auVar77._16_4_ = fVar109 + fVar118;
                            auVar77._20_4_ = fVar110 + fVar119;
                            auVar77._24_4_ = fVar111 + fVar120;
                            auVar77._28_4_ = fVar112 + auVar72._28_4_;
                            auVar78._0_4_ = fVar121 + fVar140;
                            auVar78._4_4_ = fVar125 + fVar144;
                            auVar78._8_4_ = fVar126 + fVar145;
                            auVar78._12_4_ = fVar127 + fVar146;
                            auVar78._16_4_ = fVar128 + fVar147;
                            auVar78._20_4_ = fVar129 + fVar148;
                            auVar78._24_4_ = fVar130 + fVar149;
                            auVar78._28_4_ = auVar124._28_4_ + auVar143._28_4_;
                            auVar79._0_4_ = fVar131 + fVar150;
                            auVar79._4_4_ = fVar134 + fVar153;
                            auVar79._8_4_ = fVar135 + fVar154;
                            auVar79._12_4_ = fVar136 + fVar155;
                            auVar79._16_4_ = fVar137 + fVar156;
                            auVar79._20_4_ = fVar138 + fVar157;
                            auVar79._24_4_ = fVar139 + fVar158;
                            auVar79._28_4_ = auVar133._28_4_ + auVar152._28_4_;
                            auVar80._0_4_ = fVar170 + fVar201;
                            auVar80._4_4_ = fVar173 + fVar202;
                            auVar80._8_4_ = fVar174 + fVar203;
                            auVar80._12_4_ = fVar175 + fVar204;
                            auVar80._16_4_ = fVar176 + fVar205;
                            auVar80._20_4_ = fVar177 + fVar206;
                            auVar80._24_4_ = fVar178 + fVar207;
                            auVar80._28_4_ = fVar179 + in_ZMM12._28_4_;
                            auVar81._0_4_ = fVar181 + fVar209;
                            auVar81._4_4_ = fVar183 + fVar210;
                            auVar81._8_4_ = fVar185 + fVar211;
                            auVar81._12_4_ = fVar187 + fVar212;
                            auVar81._16_4_ = fVar188 + fVar213;
                            auVar81._20_4_ = fVar190 + fVar214;
                            auVar81._24_4_ = fVar192 + fVar215;
                            auVar81._28_4_ = in_ZMM10._28_4_ + in_ZMM13._28_4_;
                            auVar82._0_4_ = fVar159 + fVar194;
                            auVar82._4_4_ = fVar163 + fVar195;
                            auVar82._8_4_ = fVar164 + fVar196;
                            auVar82._12_4_ = fVar165 + fVar197;
                            auVar82._16_4_ = fVar166 + fVar198;
                            auVar82._20_4_ = fVar167 + fVar199;
                            auVar82._24_4_ = fVar168 + fVar200;
                            auVar82._28_4_ = fVar169 + in_ZMM11._28_4_;
                            auVar83._0_4_ =
                                 fVar98 * (float)local_5c40 + fVar90 * (float)local_5ce0._0_4_;
                            auVar83._4_4_ =
                                 fVar99 * local_5c40._4_4_ + fVar92 * (float)local_5ce0._4_4_;
                            auVar83._8_4_ =
                                 fVar100 * (float)uStack_5c38 + fVar93 * (float)uStack_5cd8;
                            auVar83._12_4_ =
                                 fVar101 * uStack_5c38._4_4_ + fVar94 * uStack_5cd8._4_4_;
                            auVar83._16_4_ =
                                 fVar102 * (float)uStack_5c30 + fVar95 * (float)uStack_5cd0;
                            auVar83._20_4_ =
                                 fVar103 * uStack_5c30._4_4_ + fVar96 * uStack_5cd0._4_4_;
                            auVar83._24_4_ =
                                 fVar104 * (float)uStack_5c28 + fVar97 * pRStack_5cc8._0_4_;
                            auVar83._28_4_ = fVar179 + auVar71._28_4_;
                            auVar84._0_4_ = fVar98 * (float)local_5c20 + fVar90 * (float)local_5cc0;
                            auVar84._4_4_ = fVar99 * local_5c20._4_4_ + fVar92 * local_5cc0._4_4_;
                            auVar84._8_4_ = fVar100 * (float)uStack_5c18 + fVar93 * fStack_5cb8;
                            auVar84._12_4_ = fVar101 * uStack_5c18._4_4_ + fVar94 * fStack_5cb4;
                            auVar84._16_4_ = fVar102 * (float)uStack_5c10 + fVar95 * fStack_5cb0;
                            auVar84._20_4_ = fVar103 * uStack_5c10._4_4_ + fVar96 * fStack_5cac;
                            auVar84._24_4_ = fVar104 * (float)uStack_5c08 + fVar97 * fStack_5ca8;
                            auVar84._28_4_ = in_ZMM10._28_4_ + fVar179;
                            auVar85._0_4_ =
                                 fVar98 * (float)local_5c00._0_4_ + fVar90 * local_5ca0[0];
                            auVar85._4_4_ =
                                 fVar99 * (float)local_5c00._4_4_ + fVar92 * local_5ca0[1];
                            auVar85._8_4_ = fVar100 * fStack_5bf8 + fVar93 * local_5ca0[2];
                            auVar85._12_4_ = fVar101 * fStack_5bf4 + fVar94 * local_5ca0[3];
                            auVar85._16_4_ = fVar102 * fStack_5bf0 + fVar95 * fStack_5c90;
                            auVar85._20_4_ = fVar103 * fStack_5bec + fVar96 * fStack_5c8c;
                            auVar85._24_4_ = fVar104 * fStack_5be8 + fVar97 * fStack_5c88;
                            auVar85._28_4_ = fVar169 + auVar69._28_4_;
                            lVar60 = local_5d60._0_8_;
                          }
                          local_5c50 = *(undefined8 *)(lVar60 + 0x30);
                          uStack_5c48 = *(undefined8 *)(lVar60 + 0x38);
                          local_5c60 = *(undefined8 *)(lVar60 + 0x40);
                          uStack_5c58 = *(undefined8 *)(lVar60 + 0x48);
                          auVar74 = vsubps_avx(auVar77,auVar80);
                          auVar162 = ZEXT3264(auVar74);
                          auVar75 = vsubps_avx(auVar78,auVar81);
                          auVar172 = ZEXT3264(auVar75);
                          auVar76 = vsubps_avx(auVar79,auVar82);
                          in_ZMM11 = ZEXT3264(auVar76);
                          auVar80 = vsubps_avx(auVar83,auVar77);
                          auVar81 = vsubps_avx512vl(auVar84,auVar78);
                          auVar82 = vsubps_avx512vl(auVar85,auVar79);
                          auVar69 = vmulps_avx512vl(auVar75,auVar82);
                          auVar84 = vfmsub231ps_avx512vl(auVar69,auVar81,auVar76);
                          auVar47._4_4_ = auVar76._4_4_ * auVar80._4_4_;
                          auVar47._0_4_ = auVar76._0_4_ * auVar80._0_4_;
                          auVar47._8_4_ = auVar76._8_4_ * auVar80._8_4_;
                          auVar47._12_4_ = auVar76._12_4_ * auVar80._12_4_;
                          auVar47._16_4_ = auVar76._16_4_ * auVar80._16_4_;
                          auVar47._20_4_ = auVar76._20_4_ * auVar80._20_4_;
                          auVar47._24_4_ = auVar76._24_4_ * auVar80._24_4_;
                          auVar47._28_4_ = auVar83._28_4_;
                          auVar86 = vfmsub231ps_avx512vl(auVar47,auVar82,auVar74);
                          auVar87 = vmulps_avx512vl(auVar74,auVar81);
                          auVar19 = vfmsub231ps_fma(auVar87,auVar80,auVar75);
                          auVar85 = vsubps_avx(auVar77,*(undefined1 (*) [32])ray);
                          auVar83 = vsubps_avx(auVar78,*(undefined1 (*) [32])(ray + 0x20));
                          auVar143 = ZEXT3264(auVar83);
                          auVar77 = vsubps_avx(auVar79,*(undefined1 (*) [32])(ray + 0x40));
                          auVar152 = ZEXT3264(auVar77);
                          auVar69 = *(undefined1 (*) [32])(ray + 0x80);
                          auVar72 = *(undefined1 (*) [32])(ray + 0xa0);
                          auVar71 = *(undefined1 (*) [32])(ray + 0xc0);
                          auVar124._0_4_ = auVar72._0_4_ * auVar77._0_4_;
                          auVar124._4_4_ = auVar72._4_4_ * auVar77._4_4_;
                          auVar124._8_4_ = auVar72._8_4_ * auVar77._8_4_;
                          auVar124._12_4_ = auVar72._12_4_ * auVar77._12_4_;
                          auVar124._16_4_ = auVar72._16_4_ * auVar77._16_4_;
                          auVar124._20_4_ = auVar72._20_4_ * auVar77._20_4_;
                          auVar124._24_4_ = auVar72._24_4_ * auVar77._24_4_;
                          auVar124._28_36_ = auVar208;
                          auVar20 = vfmsub231ps_fma(auVar124._0_32_,auVar83,auVar71);
                          in_ZMM12 = ZEXT1664(auVar20);
                          auVar133._0_4_ = auVar71._0_4_ * auVar85._0_4_;
                          auVar133._4_4_ = auVar71._4_4_ * auVar85._4_4_;
                          auVar133._8_4_ = auVar71._8_4_ * auVar85._8_4_;
                          auVar133._12_4_ = auVar71._12_4_ * auVar85._12_4_;
                          auVar133._16_4_ = auVar71._16_4_ * auVar85._16_4_;
                          auVar133._20_4_ = auVar71._20_4_ * auVar85._20_4_;
                          auVar133._24_4_ = auVar71._24_4_ * auVar85._24_4_;
                          auVar133._28_36_ = auVar216;
                          auVar21 = vfmsub231ps_fma(auVar133._0_32_,auVar77,auVar69);
                          in_ZMM13 = ZEXT1664(auVar21);
                          auVar218._0_4_ = auVar69._0_4_ * auVar83._0_4_;
                          auVar218._4_4_ = auVar69._4_4_ * auVar83._4_4_;
                          auVar218._8_4_ = auVar69._8_4_ * auVar83._8_4_;
                          auVar218._12_4_ = auVar69._12_4_ * auVar83._12_4_;
                          auVar218._16_4_ = auVar69._16_4_ * auVar83._16_4_;
                          auVar218._20_4_ = auVar69._20_4_ * auVar83._20_4_;
                          auVar218._24_4_ = auVar69._24_4_ * auVar83._24_4_;
                          auVar218._28_36_ = auVar217;
                          auVar22 = vfmsub231ps_fma(auVar218._0_32_,auVar85,auVar72);
                          in_ZMM14 = ZEXT1664(auVar22);
                          auVar48._4_4_ = auVar19._4_4_ * auVar71._4_4_;
                          auVar48._0_4_ = auVar19._0_4_ * auVar71._0_4_;
                          auVar48._8_4_ = auVar19._8_4_ * auVar71._8_4_;
                          auVar48._12_4_ = auVar19._12_4_ * auVar71._12_4_;
                          auVar48._16_4_ = auVar71._16_4_ * 0.0;
                          auVar48._20_4_ = auVar71._20_4_ * 0.0;
                          auVar48._24_4_ = auVar71._24_4_ * 0.0;
                          auVar48._28_4_ = auVar71._28_4_;
                          auVar68 = vfmadd231ps_fma(auVar48,auVar86,auVar72);
                          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar84,auVar69);
                          auVar133 = ZEXT1664(auVar68);
                          vandps_avx512vl(ZEXT1632(auVar68),auVar224._0_32_);
                          in_ZMM10 = ZEXT3264(auVar87);
                          auVar69 = vmulps_avx512vl(auVar82,ZEXT1632(auVar22));
                          auVar69 = vfmadd231ps_avx512vl(auVar69,ZEXT1632(auVar21),auVar81);
                          auVar18 = vfmadd231ps_fma(auVar69,ZEXT1632(auVar20),auVar80);
                          uVar180 = auVar87._0_4_;
                          auVar123._0_4_ = uVar180 ^ auVar18._0_4_;
                          uVar182 = auVar87._4_4_;
                          auVar123._4_4_ = uVar182 ^ auVar18._4_4_;
                          uVar184 = auVar87._8_4_;
                          auVar123._8_4_ = uVar184 ^ auVar18._8_4_;
                          uVar186 = auVar87._12_4_;
                          auVar123._12_4_ = uVar186 ^ auVar18._12_4_;
                          uVar58 = auVar87._16_4_;
                          auVar123._16_4_ = uVar58;
                          uVar189 = auVar87._20_4_;
                          auVar123._20_4_ = uVar189;
                          uVar191 = auVar87._24_4_;
                          auVar123._24_4_ = uVar191;
                          uVar193 = auVar87._28_4_;
                          auVar123._28_4_ = uVar193;
                          auVar124 = ZEXT3264(auVar123);
                          uVar16 = vcmpps_avx512vl(auVar123,auVar70,5);
                          bVar57 = (byte)uVar16 & bVar63;
                          if (bVar57 == 0) {
                            bVar57 = 0;
                          }
                          else {
                            auVar49._4_4_ = auVar76._4_4_ * auVar22._4_4_;
                            auVar49._0_4_ = auVar76._0_4_ * auVar22._0_4_;
                            auVar49._8_4_ = auVar76._8_4_ * auVar22._8_4_;
                            auVar49._12_4_ = auVar76._12_4_ * auVar22._12_4_;
                            auVar49._16_4_ = auVar76._16_4_ * 0.0;
                            auVar49._20_4_ = auVar76._20_4_ * 0.0;
                            auVar49._24_4_ = auVar76._24_4_ * 0.0;
                            auVar49._28_4_ = auVar76._28_4_;
                            in_ZMM11 = ZEXT3264(auVar49);
                            auVar18 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar75,auVar49);
                            in_ZMM13 = ZEXT1664(auVar18);
                            auVar18 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar74,ZEXT1632(auVar18));
                            in_ZMM12 = ZEXT1664(auVar18);
                            auVar161._0_4_ = uVar180 ^ auVar18._0_4_;
                            auVar161._4_4_ = uVar182 ^ auVar18._4_4_;
                            auVar161._8_4_ = uVar184 ^ auVar18._8_4_;
                            auVar161._12_4_ = uVar186 ^ auVar18._12_4_;
                            auVar161._16_4_ = uVar58;
                            auVar161._20_4_ = uVar189;
                            auVar161._24_4_ = uVar191;
                            auVar161._28_4_ = uVar193;
                            auVar162 = ZEXT3264(auVar161);
                            uVar16 = vcmpps_avx512vl(auVar161,auVar70,5);
                            bVar57 = bVar57 & (byte)uVar16;
                            if (bVar57 == 0) {
                              bVar57 = 0;
                            }
                            else {
                              in_ZMM13 = ZEXT864(0) << 0x20;
                              auVar72 = auVar219._0_32_;
                              in_ZMM12 = ZEXT3264(auVar72);
                              vandps_avx512vl(ZEXT1632(auVar68),auVar72);
                              auVar172 = ZEXT3264(auVar72);
                              auVar69 = vsubps_avx(auVar72,auVar123);
                              in_ZMM11 = ZEXT3264(auVar69);
                              uVar16 = vcmpps_avx512vl(auVar69,auVar161,5);
                              bVar57 = bVar57 & (byte)uVar16;
                              if (bVar57 == 0) {
LAB_008772f9:
                                bVar57 = 0;
                              }
                              else {
                                auVar50._4_4_ = auVar19._4_4_ * auVar77._4_4_;
                                auVar50._0_4_ = auVar19._0_4_ * auVar77._0_4_;
                                auVar50._8_4_ = auVar19._8_4_ * auVar77._8_4_;
                                auVar50._12_4_ = auVar19._12_4_ * auVar77._12_4_;
                                auVar50._16_4_ = auVar77._16_4_ * 0.0;
                                auVar50._20_4_ = auVar77._20_4_ * 0.0;
                                auVar50._24_4_ = auVar77._24_4_ * 0.0;
                                auVar50._28_4_ = auVar77._28_4_;
                                auVar18 = vfmadd213ps_fma(auVar83,auVar86,auVar50);
                                auVar18 = vfmadd213ps_fma(auVar85,auVar84,ZEXT1632(auVar18));
                                auVar142._0_4_ = auVar219._0_4_ * *(float *)(ray + 0x60);
                                auVar142._4_4_ = auVar219._4_4_ * *(float *)(ray + 100);
                                auVar142._8_4_ = auVar219._8_4_ * *(float *)(ray + 0x68);
                                auVar142._12_4_ = auVar219._12_4_ * *(float *)(ray + 0x6c);
                                auVar142._16_4_ = auVar219._16_4_ * *(float *)(ray + 0x70);
                                auVar142._20_4_ = auVar219._20_4_ * *(float *)(ray + 0x74);
                                auVar142._24_4_ = auVar219._24_4_ * *(float *)(ray + 0x78);
                                auVar142._28_4_ = 0;
                                auVar143 = ZEXT3264(auVar142);
                                auVar114._0_4_ = uVar180 ^ auVar18._0_4_;
                                auVar114._4_4_ = uVar182 ^ auVar18._4_4_;
                                auVar114._8_4_ = uVar184 ^ auVar18._8_4_;
                                auVar114._12_4_ = uVar186 ^ auVar18._12_4_;
                                auVar114._16_4_ = uVar58;
                                auVar114._20_4_ = uVar189;
                                auVar114._24_4_ = uVar191;
                                auVar114._28_4_ = uVar193;
                                auVar51._4_4_ = auVar219._4_4_ * *(float *)(ray + 0x104);
                                auVar51._0_4_ = auVar219._0_4_ * *(float *)(ray + 0x100);
                                auVar51._8_4_ = auVar219._8_4_ * *(float *)(ray + 0x108);
                                auVar51._12_4_ = auVar219._12_4_ * *(float *)(ray + 0x10c);
                                auVar51._16_4_ = auVar219._16_4_ * *(float *)(ray + 0x110);
                                auVar51._20_4_ = auVar219._20_4_ * *(float *)(ray + 0x114);
                                auVar51._24_4_ = auVar219._24_4_ * *(float *)(ray + 0x118);
                                auVar51._28_4_ = auVar77._28_4_;
                                auVar152 = ZEXT3264(auVar51);
                                uVar16 = vcmpps_avx512vl(auVar114,auVar51,2);
                                uVar17 = vcmpps_avx512vl(auVar142,auVar114,1);
                                bVar57 = bVar57 & (byte)uVar16 & (byte)uVar17;
                                if (bVar57 == 0) goto LAB_008772f9;
                                uVar16 = vcmpps_avx512vl(ZEXT1632(auVar68),ZEXT832(0) << 0x20,4);
                                bVar57 = bVar57 & (byte)uVar16;
                                if (bVar57 != 0) {
                                  _local_5a60 = auVar123;
                                  _local_5a80 = auVar161;
                                  local_5aa0 = auVar114;
                                  local_5ac0 = auVar72;
                                  local_5ae0 = auVar84;
                                  local_5b00 = auVar86;
                                  local_5b20 = ZEXT1632(auVar19);
                                }
                              }
                              auVar219 = ZEXT3264(auVar72);
                              auVar68 = vxorps_avx512vl(auVar223._0_16_,auVar223._0_16_);
                              auVar223 = ZEXT1664(auVar68);
                              lVar60 = local_5d60._0_8_;
                            }
                          }
                          auVar68 = auVar223._0_16_;
                          pGVar3 = pRVar2[*(uint *)((long)&local_5c50 + uVar66 * 4)].ptr;
                          uVar180 = pGVar3->mask;
                          auVar91._4_4_ = uVar180;
                          auVar91._0_4_ = uVar180;
                          auVar91._8_4_ = uVar180;
                          auVar91._12_4_ = uVar180;
                          auVar91._16_4_ = uVar180;
                          auVar91._20_4_ = uVar180;
                          auVar91._24_4_ = uVar180;
                          auVar91._28_4_ = uVar180;
                          uVar16 = vptestmd_avx512vl(auVar91,*(undefined1 (*) [32])(ray + 0x120));
                          bVar57 = (byte)uVar16 & bVar57;
                          if (bVar57 != 0) {
                            if ((local_5d80->args->filter != (RTCFilterFunctionN)0x0) ||
                               (lVar60 = local_5d60._0_8_,
                               pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar69 = vrcp14ps_avx512vl(local_5ac0);
                              auVar72 = vfnmadd213ps_avx512vl(auVar69,local_5ac0,auVar73);
                              auVar18 = vfmadd132ps_fma(auVar72,auVar69,auVar69);
                              local_5be0._4_4_ = auVar18._4_4_ * (float)local_5a60._4_4_;
                              local_5be0._0_4_ = auVar18._0_4_ * (float)local_5a60._0_4_;
                              local_5be0._8_4_ = auVar18._8_4_ * fStack_5a58;
                              local_5be0._12_4_ = auVar18._12_4_ * fStack_5a54;
                              local_5be0._16_4_ = fStack_5a50 * 0.0;
                              local_5be0._20_4_ = fStack_5a4c * 0.0;
                              local_5be0._24_4_ = fStack_5a48 * 0.0;
                              local_5be0._28_4_ = auVar69._28_4_;
                              local_5b80 = vpbroadcastd_avx512vl();
                              local_5ba0 = vpbroadcastd_avx512vl();
                              auVar124 = ZEXT3264(local_5ba0);
                              local_5c40 = local_5ae0._0_8_;
                              uStack_5c38 = local_5ae0._8_8_;
                              uStack_5c30 = local_5ae0._16_8_;
                              uStack_5c28 = local_5ae0._24_8_;
                              local_5c20 = local_5b00._0_8_;
                              uStack_5c18 = local_5b00._8_8_;
                              uStack_5c10 = local_5b00._16_8_;
                              uStack_5c08 = local_5b00._24_8_;
                              auVar133 = ZEXT3264(local_5b20);
                              _local_5c00 = local_5b20;
                              local_5bc0 = auVar18._0_4_ * (float)local_5a80._0_4_;
                              fStack_5bbc = auVar18._4_4_ * (float)local_5a80._4_4_;
                              fStack_5bb8 = auVar18._8_4_ * fStack_5a78;
                              fStack_5bb4 = auVar18._12_4_ * fStack_5a74;
                              fStack_5bb0 = fStack_5a70 * 0.0;
                              fStack_5bac = fStack_5a6c * 0.0;
                              fStack_5ba8 = fStack_5a68 * 0.0;
                              uStack_5ba4 = local_5ac0._28_4_;
                              vpcmpeqd_avx2(local_5be0,local_5be0);
                              uStack_5b5c = local_5d80->user->instID[0];
                              local_5b60 = uStack_5b5c;
                              uStack_5b58 = uStack_5b5c;
                              uStack_5b54 = uStack_5b5c;
                              uStack_5b50 = uStack_5b5c;
                              uStack_5b4c = uStack_5b5c;
                              uStack_5b48 = uStack_5b5c;
                              uStack_5b44 = uStack_5b5c;
                              uStack_5b3c = local_5d80->user->instPrimID[0];
                              local_5b40 = uStack_5b3c;
                              uStack_5b38 = uStack_5b3c;
                              uStack_5b34 = uStack_5b3c;
                              uStack_5b30 = uStack_5b3c;
                              uStack_5b2c = uStack_5b3c;
                              uStack_5b28 = uStack_5b3c;
                              uStack_5b24 = uStack_5b3c;
                              local_5d20._0_4_ = *(int *)(ray + 0x100);
                              local_5d20._4_4_ = *(int *)(ray + 0x104);
                              iStack_5d18 = *(int *)(ray + 0x108);
                              iStack_5d14 = *(int *)(ray + 0x10c);
                              iStack_5d10 = *(int *)(ray + 0x110);
                              iStack_5d0c = *(int *)(ray + 0x114);
                              iStack_5d08 = *(int *)(ray + 0x118);
                              iStack_5d04 = *(int *)(ray + 0x11c);
                              auVar69 = vmulps_avx512vl(ZEXT1632(auVar18),local_5aa0);
                              bVar65 = (bool)(bVar57 >> 1 & 1);
                              bVar7 = (bool)(bVar57 >> 2 & 1);
                              bVar8 = (bool)(bVar57 >> 3 & 1);
                              bVar9 = (bool)(bVar57 >> 4 & 1);
                              bVar10 = (bool)(bVar57 >> 5 & 1);
                              bVar11 = (bool)(bVar57 >> 6 & 1);
                              *(uint *)(ray + 0x100) =
                                   (uint)(bVar57 & 1) * auVar69._0_4_ |
                                   (uint)!(bool)(bVar57 & 1) * (int)local_5d20;
                              *(uint *)(ray + 0x104) =
                                   (uint)bVar65 * auVar69._4_4_ | (uint)!bVar65 * local_5d20._4_4_;
                              *(uint *)(ray + 0x108) =
                                   (uint)bVar7 * auVar69._8_4_ | (uint)!bVar7 * iStack_5d18;
                              *(uint *)(ray + 0x10c) =
                                   (uint)bVar8 * auVar69._12_4_ | (uint)!bVar8 * iStack_5d14;
                              *(uint *)(ray + 0x110) =
                                   (uint)bVar9 * auVar69._16_4_ | (uint)!bVar9 * iStack_5d10;
                              *(uint *)(ray + 0x114) =
                                   (uint)bVar10 * auVar69._20_4_ | (uint)!bVar10 * iStack_5d0c;
                              *(uint *)(ray + 0x118) =
                                   (uint)bVar11 * auVar69._24_4_ | (uint)!bVar11 * iStack_5d08;
                              *(uint *)(ray + 0x11c) =
                                   (uint)(bVar57 >> 7) * auVar69._28_4_ |
                                   (uint)!(bool)(bVar57 >> 7) * iStack_5d04;
                              local_5d00 = vpmovm2d_avx512vl((ulong)bVar57);
                              local_5ce0 = (undefined1  [8])local_5d00;
                              uStack_5cd8 = pGVar3->userPtr;
                              uStack_5cd0 = local_5d80->user;
                              pRStack_5cc8 = ray;
                              local_5cc0 = (RTCHitN *)&local_5c40;
                              fStack_5cb8 = 1.12104e-44;
                              local_5d38 = uVar66;
                              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar124 = ZEXT1664(local_5ba0._0_16_);
                                auVar133 = ZEXT1664(local_5b20._0_16_);
                                auVar143 = ZEXT1664(auVar143._0_16_);
                                auVar152 = ZEXT1664(auVar152._0_16_);
                                auVar162 = ZEXT1664(auVar162._0_16_);
                                auVar172 = ZEXT1664(auVar172._0_16_);
                                in_ZMM10 = ZEXT1664(auVar87._0_16_);
                                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                in_ZMM14 = ZEXT1664(auVar22);
                                (*pGVar3->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_5ce0);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar224 = ZEXT3264(auVar69);
                                auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                auVar223 = ZEXT1664(auVar68);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar222 = ZEXT3264(auVar69);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar221 = ZEXT3264(auVar69);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar220 = ZEXT3264(auVar69);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar219 = ZEXT3264(auVar69);
                              }
                              auVar68 = auVar223._0_16_;
                              uVar66 = vptestmd_avx512vl(local_5d00,local_5d00);
                              lVar60 = local_5d60._0_8_;
                              if ((char)uVar66 != '\0') {
                                p_Var6 = local_5d80->args->filter;
                                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                   (((local_5d80->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar124 = ZEXT1664(auVar124._0_16_);
                                  auVar133 = ZEXT1664(auVar133._0_16_);
                                  auVar143 = ZEXT1664(auVar143._0_16_);
                                  auVar152 = ZEXT1664(auVar152._0_16_);
                                  auVar162 = ZEXT1664(auVar162._0_16_);
                                  auVar172 = ZEXT1664(auVar172._0_16_);
                                  in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  (*p_Var6)((RTCFilterFunctionNArguments *)local_5ce0);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar224 = ZEXT3264(auVar69);
                                  auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                  auVar223 = ZEXT1664(auVar68);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar222 = ZEXT3264(auVar69);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar221 = ZEXT3264(auVar69);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar220 = ZEXT3264(auVar69);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar219 = ZEXT3264(auVar69);
                                }
                                uVar66 = vptestmd_avx512vl(local_5d00,local_5d00);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar65 = (bool)((byte)uVar66 & 1);
                                auVar88._0_4_ =
                                     (uint)bVar65 * auVar69._0_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x100);
                                bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
                                auVar88._4_4_ =
                                     (uint)bVar65 * auVar69._4_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x104);
                                bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
                                auVar88._8_4_ =
                                     (uint)bVar65 * auVar69._8_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x108);
                                bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
                                auVar88._12_4_ =
                                     (uint)bVar65 * auVar69._12_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x10c);
                                bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
                                auVar88._16_4_ =
                                     (uint)bVar65 * auVar69._16_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x110);
                                bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
                                auVar88._20_4_ =
                                     (uint)bVar65 * auVar69._20_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x114);
                                bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
                                auVar88._24_4_ =
                                     (uint)bVar65 * auVar69._24_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x118);
                                bVar65 = SUB81(uVar66 >> 7,0);
                                auVar88._28_4_ =
                                     (uint)bVar65 * auVar69._28_4_ |
                                     (uint)!bVar65 * *(int *)(pRStack_5cc8 + 0x11c);
                                *(undefined1 (*) [32])(pRStack_5cc8 + 0x100) = auVar88;
                                lVar60 = local_5d60._0_8_;
                              }
                              bVar57 = (byte)uVar66;
                              auVar89._0_4_ =
                                   (uint)(bVar57 & 1) * *(int *)local_5d28 |
                                   (uint)!(bool)(bVar57 & 1) * (int)local_5d20;
                              bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
                              auVar89._4_4_ =
                                   (uint)bVar65 * *(int *)(local_5d28 + 4) |
                                   (uint)!bVar65 * local_5d20._4_4_;
                              bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
                              auVar89._8_4_ =
                                   (uint)bVar65 * *(int *)(local_5d28 + 8) |
                                   (uint)!bVar65 * iStack_5d18;
                              bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
                              auVar89._12_4_ =
                                   (uint)bVar65 * *(int *)(local_5d28 + 0xc) |
                                   (uint)!bVar65 * iStack_5d14;
                              bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
                              auVar89._16_4_ =
                                   (uint)bVar65 * *(int *)(local_5d28 + 0x10) |
                                   (uint)!bVar65 * iStack_5d10;
                              bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
                              auVar89._20_4_ =
                                   (uint)bVar65 * *(int *)(local_5d28 + 0x14) |
                                   (uint)!bVar65 * iStack_5d0c;
                              bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
                              auVar89._24_4_ =
                                   (uint)bVar65 * *(int *)(local_5d28 + 0x18) |
                                   (uint)!bVar65 * iStack_5d08;
                              bVar65 = SUB81(uVar66 >> 7,0);
                              auVar89._28_4_ =
                                   (uint)bVar65 * *(int *)(local_5d28 + 0x1c) |
                                   (uint)!bVar65 * iStack_5d04;
                              *(undefined1 (*) [32])local_5d28 = auVar89;
                              uVar66 = local_5d38;
                              bVar63 = (byte)local_5d88;
                            }
                            bVar63 = bVar63 & ~bVar57;
                          }
                          if ((bVar63 == 0) || (bVar65 = 2 < uVar66, uVar66 = uVar66 + 1, bVar65))
                          break;
                        }
                        local_5da9 = local_5da9 & bVar63;
                      } while ((local_5da9 != 0) && (uVar66 = local_5c68 + 1, uVar66 < local_5c70));
                      bVar63 = ~local_5da9;
                    }
                    bVar54 = bVar54 | bVar63;
                    if (bVar54 == 0xff) goto LAB_00877403;
                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    local_5840._0_4_ =
                         (uint)(bVar54 & 1) * auVar69._0_4_ |
                         (uint)!(bool)(bVar54 & 1) * local_5840._0_4_;
                    bVar65 = (bool)(bVar54 >> 1 & 1);
                    local_5840._4_4_ =
                         (uint)bVar65 * auVar69._4_4_ | (uint)!bVar65 * local_5840._4_4_;
                    bVar65 = (bool)(bVar54 >> 2 & 1);
                    local_5840._8_4_ =
                         (uint)bVar65 * auVar69._8_4_ | (uint)!bVar65 * local_5840._8_4_;
                    bVar65 = (bool)(bVar54 >> 3 & 1);
                    local_5840._12_4_ =
                         (uint)bVar65 * auVar69._12_4_ | (uint)!bVar65 * local_5840._12_4_;
                    bVar65 = (bool)(bVar54 >> 4 & 1);
                    local_5840._16_4_ =
                         (uint)bVar65 * auVar69._16_4_ | (uint)!bVar65 * local_5840._16_4_;
                    bVar65 = (bool)(bVar54 >> 5 & 1);
                    local_5840._20_4_ =
                         (uint)bVar65 * auVar69._20_4_ | (uint)!bVar65 * local_5840._20_4_;
                    bVar65 = (bool)(bVar54 >> 6 & 1);
                    local_5840._24_4_ =
                         (uint)bVar65 * auVar69._24_4_ | (uint)!bVar65 * local_5840._24_4_;
                    local_5840._28_4_ =
                         (uint)(bVar54 >> 7) * auVar69._28_4_ |
                         (uint)!(bool)(bVar54 >> 7) * local_5840._28_4_;
                    iVar55 = 0;
                    break;
                  }
                  goto LAB_00877414;
                }
                uVar56 = root.ptr & 0xfffffffffffffff0;
                auVar218 = ZEXT3264(auVar222._0_32_);
                uVar66 = 0;
                root.ptr = 8;
                do {
                  uVar61 = *(ulong *)(uVar56 + uVar66 * 8);
                  if (uVar61 != 8) {
                    uVar58 = *(undefined4 *)(uVar56 + 0x100 + uVar66 * 4);
                    auVar122._4_4_ = uVar58;
                    auVar122._0_4_ = uVar58;
                    auVar122._8_4_ = uVar58;
                    auVar122._12_4_ = uVar58;
                    auVar122._16_4_ = uVar58;
                    auVar122._20_4_ = uVar58;
                    auVar122._24_4_ = uVar58;
                    auVar122._28_4_ = uVar58;
                    auVar72 = *(undefined1 (*) [32])(ray + 0xe0);
                    uVar58 = *(undefined4 *)(uVar56 + 0x40 + uVar66 * 4);
                    auVar23._4_4_ = uVar58;
                    auVar23._0_4_ = uVar58;
                    auVar23._8_4_ = uVar58;
                    auVar23._12_4_ = uVar58;
                    auVar23._16_4_ = uVar58;
                    auVar23._20_4_ = uVar58;
                    auVar23._24_4_ = uVar58;
                    auVar23._28_4_ = uVar58;
                    auVar73 = vfmadd213ps_avx512vl(auVar122,auVar72,auVar23);
                    uVar58 = *(undefined4 *)(uVar56 + 0x140 + uVar66 * 4);
                    auVar132._4_4_ = uVar58;
                    auVar132._0_4_ = uVar58;
                    auVar132._8_4_ = uVar58;
                    auVar132._12_4_ = uVar58;
                    auVar132._16_4_ = uVar58;
                    auVar132._20_4_ = uVar58;
                    auVar132._24_4_ = uVar58;
                    auVar132._28_4_ = uVar58;
                    uVar58 = *(undefined4 *)(uVar56 + 0x80 + uVar66 * 4);
                    auVar24._4_4_ = uVar58;
                    auVar24._0_4_ = uVar58;
                    auVar24._8_4_ = uVar58;
                    auVar24._12_4_ = uVar58;
                    auVar24._16_4_ = uVar58;
                    auVar24._20_4_ = uVar58;
                    auVar24._24_4_ = uVar58;
                    auVar24._28_4_ = uVar58;
                    auVar70 = vfmadd213ps_avx512vl(auVar132,auVar72,auVar24);
                    uVar58 = *(undefined4 *)(uVar56 + 0x180 + uVar66 * 4);
                    auVar141._4_4_ = uVar58;
                    auVar141._0_4_ = uVar58;
                    auVar141._8_4_ = uVar58;
                    auVar141._12_4_ = uVar58;
                    auVar141._16_4_ = uVar58;
                    auVar141._20_4_ = uVar58;
                    auVar141._24_4_ = uVar58;
                    auVar141._28_4_ = uVar58;
                    uVar58 = *(undefined4 *)(uVar56 + 0xc0 + uVar66 * 4);
                    auVar25._4_4_ = uVar58;
                    auVar25._0_4_ = uVar58;
                    auVar25._8_4_ = uVar58;
                    auVar25._12_4_ = uVar58;
                    auVar25._16_4_ = uVar58;
                    auVar25._20_4_ = uVar58;
                    auVar25._24_4_ = uVar58;
                    auVar25._28_4_ = uVar58;
                    auVar71 = vfmadd213ps_avx512vl(auVar141,auVar72,auVar25);
                    uVar58 = *(undefined4 *)(uVar56 + 0x120 + uVar66 * 4);
                    auVar151._4_4_ = uVar58;
                    auVar151._0_4_ = uVar58;
                    auVar151._8_4_ = uVar58;
                    auVar151._12_4_ = uVar58;
                    auVar151._16_4_ = uVar58;
                    auVar151._20_4_ = uVar58;
                    auVar151._24_4_ = uVar58;
                    auVar151._28_4_ = uVar58;
                    uVar58 = *(undefined4 *)(uVar56 + 0x60 + uVar66 * 4);
                    auVar26._4_4_ = uVar58;
                    auVar26._0_4_ = uVar58;
                    auVar26._8_4_ = uVar58;
                    auVar26._12_4_ = uVar58;
                    auVar26._16_4_ = uVar58;
                    auVar26._20_4_ = uVar58;
                    auVar26._24_4_ = uVar58;
                    auVar26._28_4_ = uVar58;
                    auVar74 = vfmadd213ps_avx512vl(auVar151,auVar72,auVar26);
                    uVar58 = *(undefined4 *)(uVar56 + 0x160 + uVar66 * 4);
                    auVar160._4_4_ = uVar58;
                    auVar160._0_4_ = uVar58;
                    auVar160._8_4_ = uVar58;
                    auVar160._12_4_ = uVar58;
                    auVar160._16_4_ = uVar58;
                    auVar160._20_4_ = uVar58;
                    auVar160._24_4_ = uVar58;
                    auVar160._28_4_ = uVar58;
                    uVar58 = *(undefined4 *)(uVar56 + 0xa0 + uVar66 * 4);
                    auVar27._4_4_ = uVar58;
                    auVar27._0_4_ = uVar58;
                    auVar27._8_4_ = uVar58;
                    auVar27._12_4_ = uVar58;
                    auVar27._16_4_ = uVar58;
                    auVar27._20_4_ = uVar58;
                    auVar27._24_4_ = uVar58;
                    auVar27._28_4_ = uVar58;
                    auVar75 = vfmadd213ps_avx512vl(auVar160,auVar72,auVar27);
                    uVar58 = *(undefined4 *)(uVar56 + 0x1a0 + uVar66 * 4);
                    auVar171._4_4_ = uVar58;
                    auVar171._0_4_ = uVar58;
                    auVar171._8_4_ = uVar58;
                    auVar171._12_4_ = uVar58;
                    auVar171._16_4_ = uVar58;
                    auVar171._20_4_ = uVar58;
                    auVar171._24_4_ = uVar58;
                    auVar171._28_4_ = uVar58;
                    uVar58 = *(undefined4 *)(uVar56 + 0xe0 + uVar66 * 4);
                    auVar28._4_4_ = uVar58;
                    auVar28._0_4_ = uVar58;
                    auVar28._8_4_ = uVar58;
                    auVar28._12_4_ = uVar58;
                    auVar28._16_4_ = uVar58;
                    auVar28._20_4_ = uVar58;
                    auVar28._24_4_ = uVar58;
                    auVar28._28_4_ = uVar58;
                    auVar76 = vfmadd213ps_avx512vl(auVar171,auVar72,auVar28);
                    in_ZMM11 = ZEXT3264(local_5940);
                    auVar52._4_4_ = fStack_591c;
                    auVar52._0_4_ = local_5920;
                    auVar52._8_4_ = fStack_5918;
                    auVar52._12_4_ = fStack_5914;
                    auVar52._16_4_ = fStack_5910;
                    auVar52._20_4_ = fStack_590c;
                    auVar52._24_4_ = fStack_5908;
                    auVar52._28_4_ = uStack_5904;
                    in_ZMM12 = ZEXT3264(auVar52);
                    auVar68 = vfmsub213ps_fma(auVar73,local_5980,auVar52);
                    auVar53._4_4_ = fStack_58fc;
                    auVar53._0_4_ = local_5900;
                    auVar53._8_4_ = fStack_58f8;
                    auVar53._12_4_ = fStack_58f4;
                    auVar53._16_4_ = fStack_58f0;
                    auVar53._20_4_ = fStack_58ec;
                    auVar53._24_4_ = fStack_58e8;
                    auVar53._28_4_ = uStack_58e4;
                    in_ZMM13 = ZEXT3264(auVar53);
                    auVar18 = vfmsub213ps_fma(auVar70,local_5960,auVar53);
                    in_ZMM14 = ZEXT3264(local_58e0);
                    auVar19 = vfmsub213ps_fma(auVar71,local_5940,local_58e0);
                    auVar143 = ZEXT1664(auVar19);
                    auVar20 = vfmsub213ps_fma(auVar74,local_5980,auVar52);
                    auVar152 = ZEXT1664(auVar20);
                    auVar21 = vfmsub213ps_fma(auVar75,local_5960,auVar53);
                    auVar162 = ZEXT1664(auVar21);
                    auVar22 = vfmsub213ps_fma(auVar76,local_5940,local_58e0);
                    auVar172 = ZEXT1664(auVar22);
                    auVar73 = vpminsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar20));
                    auVar70 = vpminsd_avx2(ZEXT1632(auVar18),ZEXT1632(auVar21));
                    auVar73 = vpmaxsd_avx2(auVar73,auVar70);
                    auVar70 = vpminsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar22));
                    in_ZMM10 = ZEXT3264(auVar70);
                    auVar73 = vpmaxsd_avx2(auVar73,auVar70);
                    auVar70 = vpmaxsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar20));
                    auVar71 = vpmaxsd_avx2(ZEXT1632(auVar18),ZEXT1632(auVar21));
                    auVar71 = vpminsd_avx2(auVar70,auVar71);
                    auVar70 = vpmaxsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar22));
                    auVar71 = vpminsd_avx2(auVar71,auVar70);
                    auVar70 = vpmaxsd_avx2(auVar73,local_5860);
                    auVar124 = ZEXT3264(auVar70);
                    auVar71 = vpminsd_avx2(auVar71,local_5840);
                    auVar133 = ZEXT3264(auVar71);
                    uVar67 = vcmpps_avx512vl(auVar70,auVar71,2);
                    if ((uVar180 & 7) == 6) {
                      uVar58 = *(undefined4 *)(uVar56 + 0x1c0 + uVar66 * 4);
                      auVar29._4_4_ = uVar58;
                      auVar29._0_4_ = uVar58;
                      auVar29._8_4_ = uVar58;
                      auVar29._12_4_ = uVar58;
                      auVar29._16_4_ = uVar58;
                      auVar29._20_4_ = uVar58;
                      auVar29._24_4_ = uVar58;
                      auVar29._28_4_ = uVar58;
                      uVar14 = vcmpps_avx512vl(auVar72,auVar29,0xd);
                      uVar58 = *(undefined4 *)(uVar56 + 0x1e0 + uVar66 * 4);
                      auVar30._4_4_ = uVar58;
                      auVar30._0_4_ = uVar58;
                      auVar30._8_4_ = uVar58;
                      auVar30._12_4_ = uVar58;
                      auVar30._16_4_ = uVar58;
                      auVar30._20_4_ = uVar58;
                      auVar30._24_4_ = uVar58;
                      auVar30._28_4_ = uVar58;
                      uVar15 = vcmpps_avx512vl(auVar72,auVar30,1);
                      uVar67 = uVar67 & uVar14 & uVar15;
                    }
                    uVar14 = vcmpps_avx512vl(local_5840,auVar69,6);
                    uVar67 = uVar67 & uVar14;
                    if ((byte)uVar67 != 0) {
                      auVar73 = vblendmps_avx512vl(auVar222._0_32_,auVar73);
                      bVar65 = (bool)((byte)uVar67 & 1);
                      bVar7 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar67 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar67 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                      bVar13 = SUB81(uVar67 >> 7,0);
                      if (root.ptr != 8) {
                        *puVar64 = root.ptr;
                        puVar64 = puVar64 + 1;
                        *pauVar59 = auVar218._0_32_;
                        pauVar59 = pauVar59 + 1;
                      }
                      auVar218 = ZEXT3264(CONCAT428((uint)bVar13 * auVar73._28_4_ |
                                                    (uint)!bVar13 * auVar72._28_4_,
                                                    CONCAT424((uint)bVar12 * auVar73._24_4_ |
                                                              (uint)!bVar12 * auVar72._24_4_,
                                                              CONCAT420((uint)bVar11 *
                                                                        auVar73._20_4_ |
                                                                        (uint)!bVar11 *
                                                                        auVar72._20_4_,
                                                                        CONCAT416((uint)bVar10 *
                                                                                  auVar73._16_4_ |
                                                                                  (uint)!bVar10 *
                                                                                  auVar72._16_4_,
                                                                                  CONCAT412((uint)
                                                  bVar9 * auVar73._12_4_ |
                                                  (uint)!bVar9 * auVar72._12_4_,
                                                  CONCAT48((uint)bVar8 * auVar73._8_4_ |
                                                           (uint)!bVar8 * auVar72._8_4_,
                                                           CONCAT44((uint)bVar7 * auVar73._4_4_ |
                                                                    (uint)!bVar7 * auVar72._4_4_,
                                                                    (uint)bVar65 * auVar73._0_4_ |
                                                                    (uint)!bVar65 * auVar72._0_4_)))
                                                  )))));
                      root.ptr = uVar61;
                    }
                  }
                } while ((uVar61 != 8) && (bVar65 = uVar66 < 7, uVar66 = uVar66 + 1, bVar65));
                iVar55 = 0;
                if (root.ptr == 8) {
LAB_008769ad:
                  bVar65 = false;
                  iVar55 = 4;
                }
                else {
                  uVar16 = vcmpps_avx512vl(auVar218._0_32_,local_5840,9);
                  bVar65 = true;
                  if ((uint)POPCOUNT((int)uVar16) <= uVar62) {
                    *puVar64 = root.ptr;
                    puVar64 = puVar64 + 1;
                    *pauVar59 = auVar218._0_32_;
                    pauVar59 = pauVar59 + 1;
                    goto LAB_008769ad;
                  }
                }
              } while (bVar65);
            }
          }
        }
      } while (iVar55 != 3);
      bVar54 = bVar54 & (byte)local_5d64;
      bVar65 = (bool)(bVar54 >> 1 & 1);
      bVar7 = (bool)(bVar54 >> 2 & 1);
      bVar8 = (bool)(bVar54 >> 3 & 1);
      bVar9 = (bool)(bVar54 >> 4 & 1);
      bVar10 = (bool)(bVar54 >> 5 & 1);
      bVar11 = (bool)(bVar54 >> 6 & 1);
      *(uint *)local_5d28 =
           (uint)(bVar54 & 1) * auVar221._0_4_ | (uint)!(bool)(bVar54 & 1) * *(int *)local_5d28;
      *(uint *)(local_5d28 + 4) =
           (uint)bVar65 * auVar221._4_4_ | (uint)!bVar65 * *(int *)(local_5d28 + 4);
      *(uint *)(local_5d28 + 8) =
           (uint)bVar7 * auVar221._8_4_ | (uint)!bVar7 * *(int *)(local_5d28 + 8);
      *(uint *)(local_5d28 + 0xc) =
           (uint)bVar8 * auVar221._12_4_ | (uint)!bVar8 * *(int *)(local_5d28 + 0xc);
      *(uint *)(local_5d28 + 0x10) =
           (uint)bVar9 * auVar221._16_4_ | (uint)!bVar9 * *(int *)(local_5d28 + 0x10);
      *(uint *)(local_5d28 + 0x14) =
           (uint)bVar10 * auVar221._20_4_ | (uint)!bVar10 * *(int *)(local_5d28 + 0x14);
      *(uint *)(local_5d28 + 0x18) =
           (uint)bVar11 * auVar221._24_4_ | (uint)!bVar11 * *(int *)(local_5d28 + 0x18);
      *(uint *)(local_5d28 + 0x1c) =
           (uint)(bVar54 >> 7) * auVar221._28_4_ |
           (uint)!(bool)(bVar54 >> 7) * *(int *)(local_5d28 + 0x1c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }